

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

cf_void_t cf_list_deinit(cf_list_t *self)

{
  cf_list_node *pcVar1;
  cf_list_node_t *node;
  cf_list_iter_t it;
  cf_list_t *self_local;
  
  node = self->next;
  while (node != self) {
    pcVar1 = node->next;
    cf_free_dbg(node,
                "/workspace/llm4binary/github/license_all_cmakelists_25/tkorays[P]CFAST/src/cf/list.c"
                ,"cf_list_deinit",0x17);
    node = pcVar1;
  }
  self->next = (cf_list_node *)0x0;
  self->prev = (cf_list_node *)0x0;
  self->data = (cf_void_t *)0x0;
  return;
}

Assistant:

cf_void_t cf_list_deinit(cf_list_t* self) {
    cf_list_iter_t it = CF_NULL_PTR;
    cf_list_node_t* node = CF_NULL_PTR;
    it = cf_list_iter_init(self);
    while(it != self) {
        node = it;
        it = it->next;

        cf_free(node);
    }

    self->prev = self->next = CF_NULL_PTR;
    self->data = 0;
}